

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O1

void lddmc_gc_mark_external_refs_WRAP(WorkerP *w,Task *__dq_head,TD_lddmc_gc_mark_external_refs *t)

{
  Worker *pWVar1;
  uint64_t uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  Task *pTVar6;
  uint64_t *puStack_38;
  
  lVar5 = 0;
  puStack_38 = refs_iter(&lddmc_refs,0,lddmc_refs.refs_size);
  if (puStack_38 != (uint64_t *)0x0) {
    lVar4 = (long)__dq_head << 0x1a;
    lVar5 = 0;
    pTVar6 = __dq_head;
    do {
      uVar2 = refs_next(&lddmc_refs,&puStack_38,lddmc_refs.refs_size);
      if (__dq_head == w->end) {
        lace_abort_stack_overflow();
      }
      __dq_head->f = lddmc_gc_mark_rec_WRAP;
      __dq_head->thief = (_Worker *)0x1;
      *(uint64_t *)__dq_head->d = uVar2;
      pWVar1 = w->_public;
      if (w->allstolen == '\0') {
        if (pWVar1->movesplit != '\0') {
          uVar3 = (uint)((int)((ulong)((long)pTVar6 - (long)w->dq) >> 6) + 2 +
                        (int)((ulong)((long)w->split - (long)w->dq) >> 6)) >> 1;
          LOCK();
          (pWVar1->ts).ts.split = uVar3;
          UNLOCK();
          w->split = w->dq + uVar3;
          pWVar1->movesplit = '\0';
        }
      }
      else {
        if (pWVar1->movesplit != '\0') {
          pWVar1->movesplit = '\0';
        }
        LOCK();
        (pWVar1->ts).v =
             (lVar4 + (long)w->dq * -0x4000000 & 0xffffffff00000000U) + 0x100000000 |
             (ulong)((long)pTVar6 - (long)w->dq) >> 6 & 0xffffffff;
        UNLOCK();
        pWVar1->allstolen = '\0';
        w->split = __dq_head + 1;
        w->allstolen = '\0';
      }
      __dq_head = __dq_head + 1;
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x100000000;
      pTVar6 = pTVar6 + 1;
    } while (puStack_38 != (uint64_t *)0x0);
  }
  for (; lVar5 != 0; lVar5 = lVar5 + -1) {
    pTVar6 = __dq_head + -1;
    if ((w->_public->movesplit == '\0') && (w->split <= pTVar6)) {
      __dq_head[-1].thief = (_Worker *)0x0;
      lddmc_gc_mark_rec_CALL(w,pTVar6,*(MDD *)__dq_head[-1].d);
    }
    else {
      lddmc_gc_mark_rec_SYNC_SLOW(w,pTVar6);
    }
    __dq_head = pTVar6;
  }
  return;
}

Assistant:

VOID_TASK_0(lddmc_gc_mark_external_refs)
{
    // iterate through refs hash table, mark all found
    size_t count=0;
    uint64_t *it = refs_iter(&lddmc_refs, 0, lddmc_refs.refs_size);
    while (it != NULL) {
        SPAWN(lddmc_gc_mark_rec, refs_next(&lddmc_refs, &it, lddmc_refs.refs_size));
        count++;
    }
    while (count--) {
        SYNC(lddmc_gc_mark_rec);
    }
}